

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall
Console::Prompt::Private::stringToConcharArray
          (Private *this,String *data,Array<unsigned_int> *result)

{
  usize uVar1;
  char *pcVar2;
  uint local_54;
  char *local_50;
  char *end_1;
  char *i_1;
  usize local_38;
  usize len;
  char *end;
  char *i;
  Array<unsigned_int> *result_local;
  String *data_local;
  Private *this_local;
  
  i = (char *)result;
  result_local = (Array<unsigned_int> *)data;
  data_local = (String *)this;
  Array<unsigned_int>::clear(result);
  pcVar2 = i;
  uVar1 = String::length((String *)result_local);
  Array<unsigned_int>::reserve((Array<unsigned_int> *)pcVar2,uVar1);
  if ((this->utf8 & 1U) == 0) {
    pcVar2 = String::operator_cast_to_char_((String *)result_local);
    end_1 = pcVar2;
    uVar1 = String::length((String *)result_local);
    local_50 = pcVar2 + uVar1;
    for (; end_1 < local_50; end_1 = end_1 + 1) {
      local_54 = (uint)(byte)*end_1;
      Array<unsigned_int>::append((Array<unsigned_int> *)i,&local_54);
    }
  }
  else {
    pcVar2 = String::operator_cast_to_char_((String *)result_local);
    end = pcVar2;
    uVar1 = String::length((String *)result_local);
    len = (usize)(pcVar2 + uVar1);
    while (end < len) {
      local_38 = Unicode::length(*end);
      pcVar2 = i;
      if ((local_38 == 0) || (len - (long)end < local_38)) {
        end = end + 1;
      }
      else {
        i_1._4_4_ = Unicode::fromString(end,local_38);
        Array<unsigned_int>::append((Array<unsigned_int> *)pcVar2,(uint *)((long)&i_1 + 4));
        end = end + local_38;
      }
    }
  }
  return;
}

Assistant:

void stringToConcharArray(const String& data, Array<conchar>& result)
  {
    result.clear();
    result.reserve(data.length());
#ifdef _MSC_VER
    for(const char* i = data, * end = i + data.length(); i < end; ++i)
      result.append(*i);
#else
    if(utf8)
    {
      for(const char* i = data, * end = i + data.length(); i < end;)
      {
        usize len = Unicode::length(*i);
        if(len == 0 || (usize)(end - i) < len)
        {
          ++i;
          continue;
        }
        result.append(Unicode::fromString(i, len));
        i += len;
      }
    }
    else
      for(const char* i = data, * end = i + data.length(); i < end; ++i)
        result.append((const uchar&)*i);
#endif
  }